

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoding_backend_init__mp3
                    (void *pUserData,ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                    void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  ma_mp3 *pMP3;
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pMP3 = (ma_mp3 *)malloc(0x3f40);
  }
  else {
    if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    pMP3 = (ma_mp3 *)(*pAllocationCallbacks->onMalloc)(0x3f40,pAllocationCallbacks->pUserData);
  }
  if (pMP3 == (ma_mp3 *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  mVar1 = ma_mp3_init(onRead,onSeek,onTell,pReadSeekTellUserData,pConfig,pAllocationCallbacks,pMP3);
  if (mVar1 == MA_SUCCESS) {
    *ppBackend = pMP3;
    return MA_SUCCESS;
  }
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    free(pMP3);
    return mVar1;
  }
  if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
    (*pAllocationCallbacks->onFree)(pMP3,pAllocationCallbacks->pUserData);
    return mVar1;
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init__mp3(void* pUserData, ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_mp3* pMP3;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pMP3 = (ma_mp3*)ma_malloc(sizeof(*pMP3), pAllocationCallbacks);
    if (pMP3 == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_mp3_init(onRead, onSeek, onTell, pReadSeekTellUserData, pConfig, pAllocationCallbacks, pMP3);
    if (result != MA_SUCCESS) {
        ma_free(pMP3, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pMP3;

    return MA_SUCCESS;
}